

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O3

wchar_t rd_traps_aux(chunk *c)

{
  loc grid;
  _Bool _Var1;
  trap *trap;
  trap_kind_conflict *ptVar2;
  trap *ptVar3;
  trap_kind_conflict *ptVar4;
  player *extraout_RAX;
  player *ppVar5;
  ulong uVar6;
  uint8_t tmp8u;
  char buf [80];
  byte local_89;
  char local_88 [88];
  
  ppVar5 = player;
  if (player->is_dead == false) {
    rd_byte(&trf_size);
    while( true ) {
      trap = (trap *)mem_zalloc(0x28);
      rd_string(local_88,0x50);
      if (local_88[0] != '\0') {
        ptVar2 = lookup_trap(local_88);
        trap->kind = ptVar2;
        trap->t_idx = (uint8_t)ptVar2->tidx;
      }
      rd_byte(&local_89);
      (trap->grid).y = (uint)local_89;
      rd_byte(&local_89);
      (trap->grid).x = (uint)local_89;
      rd_byte(&trap->power);
      rd_byte(&trap->timeout);
      if (trf_size != '\0') {
        uVar6 = 0;
        do {
          rd_byte(trap->flags + uVar6);
          uVar6 = uVar6 + 1;
        } while (uVar6 < trf_size);
      }
      grid = trap->grid;
      _Var1 = loc_is_zero((loc_conflict)grid);
      if (_Var1) break;
      ptVar3 = square_trap((chunk_conflict *)c,grid);
      trap->next = ptVar3;
      square_set_trap((chunk_conflict *)c,grid,trap);
      ptVar2 = trap->kind;
      ptVar4 = lookup_trap("decoy");
      if ((ptVar2 == ptVar4) && ((chunk *)cave == c)) {
        c->decoy = grid;
      }
    }
    mem_free(trap);
    ppVar5 = extraout_RAX;
  }
  return (wchar_t)ppVar5;
}

Assistant:

static int rd_traps_aux(struct chunk *c)
{
	struct loc grid;
	struct trap *trap;

	/* Only if the player's alive */
	if (player->is_dead)
		return 0;

	rd_byte(&trf_size);

	/* Read traps until one has no location */
	while (true) {
		trap = mem_zalloc(sizeof(*trap));
		rd_trap(trap);
		grid = trap->grid;
		if (loc_is_zero(grid))
			break;
		else {
			/* Put the trap at the front of the grid trap list */
			trap->next = square_trap(c, grid);
			square_set_trap(c, grid, trap);

			/* Set decoy if appropriate */
			if ((trap->kind == lookup_trap("decoy")) &&
			    (c == cave)) {
				c->decoy = grid;
			}
		}
	}

	mem_free(trap);
	return 0;
}